

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::_makeunreachable(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  WeightedOption rest_4;
  WeightedOption rest_5;
  WeightedOption rest_6;
  WeightedOption rest_7;
  map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  *this_00;
  mapped_type *this_01;
  code *pcVar1;
  Expression *pEVar2;
  long extraout_RDX;
  long *plVar3;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  local_158;
  code *local_128;
  undefined8 uStack_120;
  code *local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  code *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  code *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  code *local_30;
  undefined8 uStack_28;
  code *local_20;
  undefined8 uStack_18;
  
  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_158._M_impl.super__Rb_tree_header._M_header;
  local_158._M_impl._0_8_ = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108 = makeLocalSet;
  uStack_100 = 0;
  local_f8 = 4;
  local_f0 = makeBlock;
  uStack_e8 = 0;
  local_e0 = 2;
  local_d8 = makeIf;
  uStack_d0 = 0;
  local_c8 = 2;
  local_c0 = makeLoop;
  uStack_b8 = 0;
  local_b0 = 2;
  local_a8 = makeBreak;
  uStack_a0 = 0;
  local_98 = 2;
  local_90 = makeStore;
  uStack_88 = 0;
  local_80 = 2;
  local_78 = makeUnary;
  uStack_70 = 0;
  local_68 = 2;
  local_60 = makeBinary;
  uStack_58 = 0;
  local_50 = 2;
  local_48 = makeUnreachable;
  uStack_40 = 0;
  local_38 = 2;
  local_20 = makeSelect;
  uStack_18 = 0;
  local_30 = makeSwitch;
  uStack_28 = 0;
  local_128 = makeDrop;
  uStack_120 = 0;
  local_118 = makeReturn;
  uStack_110 = 0;
  weightedOption.weight = 4;
  weightedOption._0_16_ = ZEXT816(0x13c0b0);
  rest.weight = 2;
  rest._0_16_ = ZEXT816(0x13af88);
  rest_1.weight = 2;
  rest_1._0_16_ = ZEXT816(0x13cf74);
  rest_2.weight = 2;
  rest_2._0_16_ = ZEXT816(0x13d02a);
  rest_3.weight = 2;
  rest_3._0_16_ = ZEXT816(0x13d21a);
  rest_4.weight = 2;
  rest_4._0_16_ = ZEXT816(0x140496);
  rest_5.weight = 2;
  rest_5._0_16_ = ZEXT816(0x13db6a);
  rest_6.weight = 2;
  rest_6._0_16_ = ZEXT816(0x13e348);
  rest_7.weight = 2;
  rest_7._0_16_ = ZEXT816(0x140774);
  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)&local_158,(FeatureSet)0x0,weightedOption,rest,rest_1,rest_2,rest_3,
                        rest_4,rest_5,rest_6,rest_7,0x13d4fe,0,0x13d71a,0,0x13e942,0)->options;
  local_30 = (code *)CONCAT44(local_30._4_4_,0x500);
  local_20 = makeCallRef;
  uStack_18 = 0;
  this_01 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
            ::operator[](this_00,(key_type *)&local_30);
  std::
  vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
  ::push_back(this_01,(value_type *)&local_20);
  pcVar1 = (code *)_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                             (&this->random,
                              (FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                               *)&local_158);
  plVar3 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar3 + -1);
  }
  pEVar2 = (Expression *)(*pcVar1)(plVar3,1);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  ::~_Rb_tree(&local_158);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::_makeunreachable() {
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         WeightedOption{&Self::makeUnary, Important},
         WeightedOption{&Self::makeBinary, Important},
         WeightedOption{&Self::makeUnreachable, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeSelect,
         &Self::makeSwitch,
         &Self::makeDrop,
         &Self::makeReturn)
    .add(FeatureSet::GC | FeatureSet::ReferenceTypes, &Self::makeCallRef);
  return (this->*pick(options))(Type::unreachable);
}